

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_TPIStream.cpp
# Opt level: O0

TPIStream * __thiscall PDB::TPIStream::operator=(TPIStream *this,TPIStream *other)

{
  uint32_t uVar1;
  TPIStream *other_local;
  TPIStream *this_local;
  
  if (this != other) {
    (this->m_stream).m_data = (other->m_stream).m_data;
    (this->m_stream).m_blockIndices = (other->m_stream).m_blockIndices;
    uVar1 = (other->m_stream).m_size;
    (this->m_stream).m_blockSize = (other->m_stream).m_blockSize;
    (this->m_stream).m_size = uVar1;
    (this->m_stream).m_blockSizeLog2 = (other->m_stream).m_blockSizeLog2;
    memcpy(&this->m_header,&other->m_header,0x38);
    this->m_recordCount = other->m_recordCount;
    other->m_recordCount = 0;
  }
  return this;
}

Assistant:

PDB::TPIStream& PDB::TPIStream::operator=(TPIStream&& other) PDB_NO_EXCEPT
{
	if (this != &other)
	{
		m_stream = PDB_MOVE(other.m_stream);
		m_header = PDB_MOVE(other.m_header);
		m_recordCount = PDB_MOVE(other.m_recordCount);

		other.m_recordCount = 0u;
	}

	return *this;
}